

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

bool __thiscall
server_context::can_be_detokenized
          (server_context *this,llama_context *ctx,vector<int,_std::allocator<int>_> *tokens)

{
  bool bVar1;
  const_iterator __lhs;
  undefined8 in_RDX;
  undefined8 in_RSI;
  int *token;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int32_t n_vocab;
  llama_vocab *vocab;
  llama_model *model;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  undefined8 local_40;
  int local_34;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  local_20 = in_RDX;
  local_28 = llama_get_model(in_RSI);
  local_30 = llama_model_get_vocab(local_28);
  local_34 = llama_vocab_n_tokens(local_30);
  local_40 = local_20;
  local_48._M_current =
       (int *)httplib::detail::std::vector<int,_std::allocator<int>_>::begin
                        (in_stack_ffffffffffffffa8);
  __lhs = httplib::detail::std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       __lhs._M_current,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffffa8);
    if (!bVar1) {
      return true;
    }
    in_stack_ffffffffffffffa8 =
         (vector<int,_std::allocator<int>_> *)
         __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
         operator*(&local_48);
    if ((*(int *)&(in_stack_ffffffffffffffa8->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                  .super__Vector_impl_data._M_start < 0) ||
       (local_34 <=
        *(int *)&(in_stack_ffffffffffffffa8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start)) break;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_48);
  }
  return false;
}

Assistant:

bool can_be_detokenized(const struct llama_context * ctx, const std::vector<llama_token> & tokens) {
        const llama_model * model = llama_get_model(ctx);
        const llama_vocab * vocab = llama_model_get_vocab(model);
        const int32_t n_vocab = llama_vocab_n_tokens(vocab);
        for (const auto & token : tokens) {
            if (token < 0 || token >= n_vocab) {
                return false;
            }
        }
        return true;
    }